

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_int32 *
ma_dr_wav_open_memory_and_read_pcm_frames_s32
          (void *data,size_t dataSize,uint *channelsOut,uint *sampleRateOut,
          ma_uint64 *totalFrameCountOut,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined8 *in_R8;
  ma_dr_wav wav;
  ma_allocation_callbacks *in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe40;
  void *in_stack_fffffffffffffe48;
  ma_dr_wav *in_stack_fffffffffffffe50;
  uint *in_stack_fffffffffffffe58;
  uint *in_stack_fffffffffffffe60;
  ma_dr_wav *in_stack_fffffffffffffe68;
  undefined8 local_8;
  
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0;
  }
  if (in_R8 != (undefined8 *)0x0) {
    *in_R8 = 0;
  }
  mVar1 = ma_dr_wav_init_memory
                    (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                     in_stack_fffffffffffffe38);
  if (mVar1 == 0) {
    local_8 = (ma_int32 *)0x0;
  }
  else {
    local_8 = ma_dr_wav__read_pcm_frames_and_close_s32
                        (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                         in_stack_fffffffffffffe58,(ma_uint64 *)in_stack_fffffffffffffe50);
  }
  return local_8;
}

Assistant:

MA_API ma_int32* ma_dr_wav_open_memory_and_read_pcm_frames_s32(const void* data, size_t dataSize, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_wav wav;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalFrameCountOut) {
        *totalFrameCountOut = 0;
    }
    if (!ma_dr_wav_init_memory(&wav, data, dataSize, pAllocationCallbacks)) {
        return NULL;
    }
    return ma_dr_wav__read_pcm_frames_and_close_s32(&wav, channelsOut, sampleRateOut, totalFrameCountOut);
}